

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsTypesX.hpp
# Opt level: O0

RayTracingPipelineStateCreateInfoX * __thiscall
Diligent::RayTracingPipelineStateCreateInfoX::SyncDesc
          (RayTracingPipelineStateCreateInfoX *this,SYNC_FLAGS UpdateFlags)

{
  bool bVar1;
  size_type sVar2;
  Char *pCVar3;
  reference pRVar4;
  reference pRVar5;
  reference pRVar6;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar7;
  RayTracingProceduralHitShaderGroup *local_1a0;
  RayTracingTriangleHitShaderGroup *local_198;
  RayTracingGeneralShaderGroup *local_190;
  RayTracingProceduralHitShaderGroup *Shader_5;
  iterator __end3_5;
  iterator __begin3_5;
  vector<Diligent::RayTracingProceduralHitShaderGroup,_std::allocator<Diligent::RayTracingProceduralHitShaderGroup>_>
  *__range3_5;
  RayTracingTriangleHitShaderGroup *Shader_4;
  iterator __end3_4;
  iterator __begin3_4;
  vector<Diligent::RayTracingTriangleHitShaderGroup,_std::allocator<Diligent::RayTracingTriangleHitShaderGroup>_>
  *__range3_4;
  RayTracingGeneralShaderGroup *Shader_3;
  iterator __end3_3;
  iterator __begin3_3;
  vector<Diligent::RayTracingGeneralShaderGroup,_std::allocator<Diligent::RayTracingGeneralShaderGroup>_>
  *__range3_3;
  vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
  OldShaderObjects;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_e8;
  undefined1 local_e0;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_d8;
  undefined1 local_d0;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_c8;
  undefined1 local_c0;
  reference local_b8;
  RayTracingProceduralHitShaderGroup *Shader_2;
  iterator __end3_2;
  iterator __begin3_2;
  vector<Diligent::RayTracingProceduralHitShaderGroup,_std::allocator<Diligent::RayTracingProceduralHitShaderGroup>_>
  *__range3_2;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_88;
  undefined1 local_80;
  reference local_78;
  RayTracingTriangleHitShaderGroup *Shader_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<Diligent::RayTracingTriangleHitShaderGroup,_std::allocator<Diligent::RayTracingTriangleHitShaderGroup>_>
  *__range3_1;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_48;
  undefined1 local_40;
  reference local_38;
  RayTracingGeneralShaderGroup *Shader;
  iterator __end3;
  iterator __begin3;
  vector<Diligent::RayTracingGeneralShaderGroup,_std::allocator<Diligent::RayTracingGeneralShaderGroup>_>
  *__range3;
  SYNC_FLAGS UpdateFlags_local;
  RayTracingPipelineStateCreateInfoX *this_local;
  
  sVar2 = std::
          vector<Diligent::RayTracingGeneralShaderGroup,_std::allocator<Diligent::RayTracingGeneralShaderGroup>_>
          ::size(&this->GeneralShaders);
  (this->
  super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
  ).super_RayTracingPipelineStateCreateInfo.GeneralShaderCount = (Uint32)sVar2;
  if ((this->
      super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
      ).super_RayTracingPipelineStateCreateInfo.GeneralShaderCount == 0) {
    local_190 = (RayTracingGeneralShaderGroup *)0x0;
  }
  else {
    local_190 = std::
                vector<Diligent::RayTracingGeneralShaderGroup,_std::allocator<Diligent::RayTracingGeneralShaderGroup>_>
                ::data(&this->GeneralShaders);
  }
  (this->
  super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
  ).super_RayTracingPipelineStateCreateInfo.pGeneralShaders = local_190;
  sVar2 = std::
          vector<Diligent::RayTracingTriangleHitShaderGroup,_std::allocator<Diligent::RayTracingTriangleHitShaderGroup>_>
          ::size(&this->TriangleHitShaders);
  (this->
  super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
  ).super_RayTracingPipelineStateCreateInfo.TriangleHitShaderCount = (Uint32)sVar2;
  if ((this->
      super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
      ).super_RayTracingPipelineStateCreateInfo.TriangleHitShaderCount == 0) {
    local_198 = (RayTracingTriangleHitShaderGroup *)0x0;
  }
  else {
    local_198 = std::
                vector<Diligent::RayTracingTriangleHitShaderGroup,_std::allocator<Diligent::RayTracingTriangleHitShaderGroup>_>
                ::data(&this->TriangleHitShaders);
  }
  (this->
  super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
  ).super_RayTracingPipelineStateCreateInfo.pTriangleHitShaders = local_198;
  sVar2 = std::
          vector<Diligent::RayTracingProceduralHitShaderGroup,_std::allocator<Diligent::RayTracingProceduralHitShaderGroup>_>
          ::size(&this->ProceduralHitShaders);
  (this->
  super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
  ).super_RayTracingPipelineStateCreateInfo.ProceduralHitShaderCount = (Uint32)sVar2;
  if ((this->
      super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
      ).super_RayTracingPipelineStateCreateInfo.ProceduralHitShaderCount == 0) {
    local_1a0 = (RayTracingProceduralHitShaderGroup *)0x0;
  }
  else {
    local_1a0 = std::
                vector<Diligent::RayTracingProceduralHitShaderGroup,_std::allocator<Diligent::RayTracingProceduralHitShaderGroup>_>
                ::data(&this->ProceduralHitShaders);
  }
  (this->
  super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
  ).super_RayTracingPipelineStateCreateInfo.pProceduralHitShaders = local_1a0;
  if ((UpdateFlags & SYNC_FLAG_UPDATE_STRINGS) != SYNC_FLAG_NONE) {
    __end3 = std::
             vector<Diligent::RayTracingGeneralShaderGroup,_std::allocator<Diligent::RayTracingGeneralShaderGroup>_>
             ::begin(&this->GeneralShaders);
    Shader = (RayTracingGeneralShaderGroup *)
             std::
             vector<Diligent::RayTracingGeneralShaderGroup,_std::allocator<Diligent::RayTracingGeneralShaderGroup>_>
             ::end(&this->GeneralShaders);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<Diligent::RayTracingGeneralShaderGroup_*,_std::vector<Diligent::RayTracingGeneralShaderGroup,_std::allocator<Diligent::RayTracingGeneralShaderGroup>_>_>
                                       *)&Shader), bVar1) {
      local_38 = __gnu_cxx::
                 __normal_iterator<Diligent::RayTracingGeneralShaderGroup_*,_std::vector<Diligent::RayTracingGeneralShaderGroup,_std::allocator<Diligent::RayTracingGeneralShaderGroup>_>_>
                 ::operator*(&__end3);
      pVar7 = std::
              unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::emplace<char_const*&>
                        ((unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&(this->
                             super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
                             ).StringPool,&local_38->Name);
      local_48._M_cur =
           (__node_type *)
           pVar7.first.
           super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ._M_cur;
      local_40 = pVar7.second;
      std::__detail::
      _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
      ::operator->((_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                    *)&local_48);
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      local_38->Name = pCVar3;
      __gnu_cxx::
      __normal_iterator<Diligent::RayTracingGeneralShaderGroup_*,_std::vector<Diligent::RayTracingGeneralShaderGroup,_std::allocator<Diligent::RayTracingGeneralShaderGroup>_>_>
      ::operator++(&__end3);
    }
    __end3_1 = std::
               vector<Diligent::RayTracingTriangleHitShaderGroup,_std::allocator<Diligent::RayTracingTriangleHitShaderGroup>_>
               ::begin(&this->TriangleHitShaders);
    Shader_1 = (RayTracingTriangleHitShaderGroup *)
               std::
               vector<Diligent::RayTracingTriangleHitShaderGroup,_std::allocator<Diligent::RayTracingTriangleHitShaderGroup>_>
               ::end(&this->TriangleHitShaders);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3_1,
                              (__normal_iterator<Diligent::RayTracingTriangleHitShaderGroup_*,_std::vector<Diligent::RayTracingTriangleHitShaderGroup,_std::allocator<Diligent::RayTracingTriangleHitShaderGroup>_>_>
                               *)&Shader_1), bVar1) {
      local_78 = __gnu_cxx::
                 __normal_iterator<Diligent::RayTracingTriangleHitShaderGroup_*,_std::vector<Diligent::RayTracingTriangleHitShaderGroup,_std::allocator<Diligent::RayTracingTriangleHitShaderGroup>_>_>
                 ::operator*(&__end3_1);
      pVar7 = std::
              unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::emplace<char_const*&>
                        ((unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&(this->
                             super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
                             ).StringPool,&local_78->Name);
      local_88._M_cur =
           (__node_type *)
           pVar7.first.
           super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ._M_cur;
      local_80 = pVar7.second;
      std::__detail::
      _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
      ::operator->((_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                    *)&local_88);
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      local_78->Name = pCVar3;
      __gnu_cxx::
      __normal_iterator<Diligent::RayTracingTriangleHitShaderGroup_*,_std::vector<Diligent::RayTracingTriangleHitShaderGroup,_std::allocator<Diligent::RayTracingTriangleHitShaderGroup>_>_>
      ::operator++(&__end3_1);
    }
    __end3_2 = std::
               vector<Diligent::RayTracingProceduralHitShaderGroup,_std::allocator<Diligent::RayTracingProceduralHitShaderGroup>_>
               ::begin(&this->ProceduralHitShaders);
    Shader_2 = (RayTracingProceduralHitShaderGroup *)
               std::
               vector<Diligent::RayTracingProceduralHitShaderGroup,_std::allocator<Diligent::RayTracingProceduralHitShaderGroup>_>
               ::end(&this->ProceduralHitShaders);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3_2,
                              (__normal_iterator<Diligent::RayTracingProceduralHitShaderGroup_*,_std::vector<Diligent::RayTracingProceduralHitShaderGroup,_std::allocator<Diligent::RayTracingProceduralHitShaderGroup>_>_>
                               *)&Shader_2), bVar1) {
      local_b8 = __gnu_cxx::
                 __normal_iterator<Diligent::RayTracingProceduralHitShaderGroup_*,_std::vector<Diligent::RayTracingProceduralHitShaderGroup,_std::allocator<Diligent::RayTracingProceduralHitShaderGroup>_>_>
                 ::operator*(&__end3_2);
      pVar7 = std::
              unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::emplace<char_const*&>
                        ((unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&(this->
                             super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
                             ).StringPool,&local_b8->Name);
      local_d8._M_cur =
           (__node_type *)
           pVar7.first.
           super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ._M_cur;
      local_d0 = pVar7.second;
      local_c8._M_cur = local_d8._M_cur;
      local_c0 = local_d0;
      std::__detail::
      _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
      ::operator->((_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                    *)&local_c8);
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      local_b8->Name = pCVar3;
      __gnu_cxx::
      __normal_iterator<Diligent::RayTracingProceduralHitShaderGroup_*,_std::vector<Diligent::RayTracingProceduralHitShaderGroup,_std::allocator<Diligent::RayTracingProceduralHitShaderGroup>_>_>
      ::operator++(&__end3_2);
    }
    if ((this->
        super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
        ).super_RayTracingPipelineStateCreateInfo.pShaderRecordName != (Char *)0x0) {
      pVar7 = std::
              unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              ::emplace<char_const*&>
                        ((unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                          *)&(this->
                             super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
                             ).StringPool,
                         &(this->
                          super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
                          ).super_RayTracingPipelineStateCreateInfo.pShaderRecordName);
      OldShaderObjects.
      super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)pVar7.first.
                    super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    ._M_cur;
      local_e0 = pVar7.second;
      local_e8._M_cur =
           (__node_type *)
           OldShaderObjects.
           super__Vector_base<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::__detail::
      _Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
      ::operator->((_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                    *)&local_e8);
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      (this->
      super_PipelineStateCreateInfoX<Diligent::RayTracingPipelineStateCreateInfoX,_Diligent::RayTracingPipelineStateCreateInfo>
      ).super_RayTracingPipelineStateCreateInfo.pShaderRecordName = pCVar3;
    }
  }
  if ((UpdateFlags & SYNC_FLAG_UPDATE_SHADERS) != SYNC_FLAG_NONE) {
    std::
    vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
    ::vector((vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
              *)&__range3_3,&this->ShaderObjects);
    std::
    vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
    ::clear(&this->ShaderObjects);
    __end3_3 = std::
               vector<Diligent::RayTracingGeneralShaderGroup,_std::allocator<Diligent::RayTracingGeneralShaderGroup>_>
               ::begin(&this->GeneralShaders);
    Shader_3 = (RayTracingGeneralShaderGroup *)
               std::
               vector<Diligent::RayTracingGeneralShaderGroup,_std::allocator<Diligent::RayTracingGeneralShaderGroup>_>
               ::end(&this->GeneralShaders);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3_3,
                              (__normal_iterator<Diligent::RayTracingGeneralShaderGroup_*,_std::vector<Diligent::RayTracingGeneralShaderGroup,_std::allocator<Diligent::RayTracingGeneralShaderGroup>_>_>
                               *)&Shader_3), bVar1) {
      pRVar4 = __gnu_cxx::
               __normal_iterator<Diligent::RayTracingGeneralShaderGroup_*,_std::vector<Diligent::RayTracingGeneralShaderGroup,_std::allocator<Diligent::RayTracingGeneralShaderGroup>_>_>
               ::operator*(&__end3_3);
      if (pRVar4->pShader != (IShader *)0x0) {
        std::
        vector<Diligent::RefCntAutoPtr<Diligent::IShader>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>>>
        ::emplace_back<Diligent::IShader*&>
                  ((vector<Diligent::RefCntAutoPtr<Diligent::IShader>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>>>
                    *)&this->ShaderObjects,&pRVar4->pShader);
      }
      __gnu_cxx::
      __normal_iterator<Diligent::RayTracingGeneralShaderGroup_*,_std::vector<Diligent::RayTracingGeneralShaderGroup,_std::allocator<Diligent::RayTracingGeneralShaderGroup>_>_>
      ::operator++(&__end3_3);
    }
    __end3_4 = std::
               vector<Diligent::RayTracingTriangleHitShaderGroup,_std::allocator<Diligent::RayTracingTriangleHitShaderGroup>_>
               ::begin(&this->TriangleHitShaders);
    Shader_4 = (RayTracingTriangleHitShaderGroup *)
               std::
               vector<Diligent::RayTracingTriangleHitShaderGroup,_std::allocator<Diligent::RayTracingTriangleHitShaderGroup>_>
               ::end(&this->TriangleHitShaders);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3_4,
                              (__normal_iterator<Diligent::RayTracingTriangleHitShaderGroup_*,_std::vector<Diligent::RayTracingTriangleHitShaderGroup,_std::allocator<Diligent::RayTracingTriangleHitShaderGroup>_>_>
                               *)&Shader_4), bVar1) {
      pRVar5 = __gnu_cxx::
               __normal_iterator<Diligent::RayTracingTriangleHitShaderGroup_*,_std::vector<Diligent::RayTracingTriangleHitShaderGroup,_std::allocator<Diligent::RayTracingTriangleHitShaderGroup>_>_>
               ::operator*(&__end3_4);
      if (pRVar5->pClosestHitShader != (IShader *)0x0) {
        std::
        vector<Diligent::RefCntAutoPtr<Diligent::IShader>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>>>
        ::emplace_back<Diligent::IShader*&>
                  ((vector<Diligent::RefCntAutoPtr<Diligent::IShader>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>>>
                    *)&this->ShaderObjects,&pRVar5->pClosestHitShader);
      }
      if (pRVar5->pAnyHitShader != (IShader *)0x0) {
        std::
        vector<Diligent::RefCntAutoPtr<Diligent::IShader>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>>>
        ::emplace_back<Diligent::IShader*&>
                  ((vector<Diligent::RefCntAutoPtr<Diligent::IShader>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>>>
                    *)&this->ShaderObjects,&pRVar5->pAnyHitShader);
      }
      __gnu_cxx::
      __normal_iterator<Diligent::RayTracingTriangleHitShaderGroup_*,_std::vector<Diligent::RayTracingTriangleHitShaderGroup,_std::allocator<Diligent::RayTracingTriangleHitShaderGroup>_>_>
      ::operator++(&__end3_4);
    }
    __end3_5 = std::
               vector<Diligent::RayTracingProceduralHitShaderGroup,_std::allocator<Diligent::RayTracingProceduralHitShaderGroup>_>
               ::begin(&this->ProceduralHitShaders);
    Shader_5 = (RayTracingProceduralHitShaderGroup *)
               std::
               vector<Diligent::RayTracingProceduralHitShaderGroup,_std::allocator<Diligent::RayTracingProceduralHitShaderGroup>_>
               ::end(&this->ProceduralHitShaders);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3_5,
                              (__normal_iterator<Diligent::RayTracingProceduralHitShaderGroup_*,_std::vector<Diligent::RayTracingProceduralHitShaderGroup,_std::allocator<Diligent::RayTracingProceduralHitShaderGroup>_>_>
                               *)&Shader_5), bVar1) {
      pRVar6 = __gnu_cxx::
               __normal_iterator<Diligent::RayTracingProceduralHitShaderGroup_*,_std::vector<Diligent::RayTracingProceduralHitShaderGroup,_std::allocator<Diligent::RayTracingProceduralHitShaderGroup>_>_>
               ::operator*(&__end3_5);
      if (pRVar6->pIntersectionShader != (IShader *)0x0) {
        std::
        vector<Diligent::RefCntAutoPtr<Diligent::IShader>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>>>
        ::emplace_back<Diligent::IShader*&>
                  ((vector<Diligent::RefCntAutoPtr<Diligent::IShader>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>>>
                    *)&this->ShaderObjects,&pRVar6->pIntersectionShader);
      }
      if (pRVar6->pClosestHitShader != (IShader *)0x0) {
        std::
        vector<Diligent::RefCntAutoPtr<Diligent::IShader>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>>>
        ::emplace_back<Diligent::IShader*&>
                  ((vector<Diligent::RefCntAutoPtr<Diligent::IShader>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>>>
                    *)&this->ShaderObjects,&pRVar6->pClosestHitShader);
      }
      if (pRVar6->pAnyHitShader != (IShader *)0x0) {
        std::
        vector<Diligent::RefCntAutoPtr<Diligent::IShader>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>>>
        ::emplace_back<Diligent::IShader*&>
                  ((vector<Diligent::RefCntAutoPtr<Diligent::IShader>,std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>>>
                    *)&this->ShaderObjects,&pRVar6->pAnyHitShader);
      }
      __gnu_cxx::
      __normal_iterator<Diligent::RayTracingProceduralHitShaderGroup_*,_std::vector<Diligent::RayTracingProceduralHitShaderGroup,_std::allocator<Diligent::RayTracingProceduralHitShaderGroup>_>_>
      ::operator++(&__end3_5);
    }
    std::
    vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
    ::~vector((vector<Diligent::RefCntAutoPtr<Diligent::IShader>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::IShader>_>_>
               *)&__range3_3);
  }
  return this;
}

Assistant:

RayTracingPipelineStateCreateInfoX& SyncDesc(SYNC_FLAGS UpdateFlags)
    {
        GeneralShaderCount = static_cast<Uint32>(GeneralShaders.size());
        pGeneralShaders    = GeneralShaderCount > 0 ? GeneralShaders.data() : nullptr;

        TriangleHitShaderCount = static_cast<Uint32>(TriangleHitShaders.size());
        pTriangleHitShaders    = TriangleHitShaderCount > 0 ? TriangleHitShaders.data() : nullptr;

        ProceduralHitShaderCount = static_cast<Uint32>(ProceduralHitShaders.size());
        pProceduralHitShaders    = ProceduralHitShaderCount > 0 ? ProceduralHitShaders.data() : nullptr;

        if ((UpdateFlags & SYNC_FLAG_UPDATE_STRINGS) != 0)
        {
            for (auto& Shader : GeneralShaders)
                Shader.Name = StringPool.emplace(Shader.Name).first->c_str();

            for (auto& Shader : TriangleHitShaders)
                Shader.Name = StringPool.emplace(Shader.Name).first->c_str();

            for (auto& Shader : ProceduralHitShaders)
                Shader.Name = StringPool.emplace(Shader.Name).first->c_str();

            if (pShaderRecordName != nullptr)
                pShaderRecordName = StringPool.emplace(pShaderRecordName).first->c_str();
        }

        if ((UpdateFlags & SYNC_FLAG_UPDATE_SHADERS) != 0)
        {
            // Keep current shader objects alive
            std::vector<RefCntAutoPtr<IShader>> OldShaderObjects = std::move(ShaderObjects);

            ShaderObjects.clear();
            for (auto& Shader : GeneralShaders)
            {
                if (Shader.pShader != nullptr)
                    ShaderObjects.emplace_back(Shader.pShader);
            }

            for (auto& Shader : TriangleHitShaders)
            {
                if (Shader.pClosestHitShader != nullptr)
                    ShaderObjects.emplace_back(Shader.pClosestHitShader);
                if (Shader.pAnyHitShader != nullptr)
                    ShaderObjects.emplace_back(Shader.pAnyHitShader);
            }

            for (auto& Shader : ProceduralHitShaders)
            {
                if (Shader.pIntersectionShader != nullptr)
                    ShaderObjects.emplace_back(Shader.pIntersectionShader);
                if (Shader.pClosestHitShader != nullptr)
                    ShaderObjects.emplace_back(Shader.pClosestHitShader);
                if (Shader.pAnyHitShader != nullptr)
                    ShaderObjects.emplace_back(Shader.pAnyHitShader);
            }
        }

        return *this;
    }